

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOWFileParser.cpp
# Opt level: O3

void __thiscall BOWFileParser::readBOWFile(BOWFileParser *this)

{
  int iVar1;
  BOWFileParser *pBVar2;
  _Alloc_hider __nptr;
  char cVar3;
  uint uVar4;
  istream *piVar5;
  int *piVar6;
  long lVar7;
  int iVar8;
  bool bVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> intVec;
  string token;
  string str;
  istringstream stream;
  int local_230;
  uint local_22c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_228;
  BOWFileParser *local_210;
  value_type local_208;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1e0;
  pointer local_1d8;
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0 [16];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  lVar7 = *(long *)(*(long *)this + -0x18);
  if (((&this->field_0x20)[lVar7] & 5) != 0) {
LAB_00115d0f:
    std::operator<<((ostream *)&std::cout,"Cannot open BOWfile");
    exit(1);
  }
  local_1d0 = local_1c0;
  local_1c8 = 0;
  local_1c0[0] = 0;
  local_1e8 = &this->_frequencyMatrix;
  local_1e0 = &this->_wordList;
  local_230 = 0;
  local_210 = this;
  do {
    pBVar2 = local_210;
    cVar3 = std::ios::widen((char)lVar7 + (char)local_210);
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)pBVar2,(string *)&local_1d0,cVar3);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
      local_210->_V =
           (uint)((ulong)((long)(local_210->_wordList).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_210->_wordList).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5);
      if (local_1d0 != local_1c0) {
        operator_delete(local_1d0);
      }
      return;
    }
    local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (uint *)0x0;
    local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
    local_208._M_string_length = 0;
    local_208.field_2._M_local_buf[0] = '\0';
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_1d0,_S_in);
    if (local_230 == 0) {
      iVar8 = 0;
      while( true ) {
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_1b0,(string *)&local_208,',');
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
        bVar9 = iVar8 != 0;
        iVar8 = iVar8 + -1;
        if (bVar9) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_1e0,&local_208);
        }
      }
    }
    else {
      iVar8 = 0;
LAB_00115b6b:
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_1b0,(string *)&local_208,',');
      __nptr._M_p = local_208._M_dataplus._M_p;
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
        bVar9 = iVar8 != 0;
        iVar8 = iVar8 + -1;
        if (bVar9) {
          piVar6 = __errno_location();
          iVar1 = *piVar6;
          *piVar6 = 0;
          lVar7 = strtol(__nptr._M_p,&local_1d8,10);
          if (local_1d8 == __nptr._M_p) {
            std::__throw_invalid_argument("stoi");
          }
          else {
            uVar4 = (uint)lVar7;
            if (((int)uVar4 == lVar7) && (*piVar6 != 0x22)) {
              if (*piVar6 == 0) {
                *piVar6 = iVar1;
              }
              local_22c = uVar4;
              if (local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          (&local_228,
                           (iterator)
                           local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_22c);
              }
              else {
                *local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish = uVar4;
                local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              goto LAB_00115b6b;
            }
          }
          std::__throw_out_of_range("stoi");
          goto LAB_00115d0f;
        }
        goto LAB_00115b6b;
      }
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::push_back(local_1e8,&local_228);
    }
    std::__cxx11::istringstream::~istringstream(local_1b0);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    if (local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    local_230 = local_230 + 1;
    lVar7 = *(long *)(*(long *)local_210 + -0x18);
  } while( true );
}

Assistant:

void BOWFileParser::readBOWFile(){//{{{
    if(!_inputText){
        cout<<"Cannot open BOWfile";
        exit(1);
    }
    string str;
    for(int i=0;getline(_inputText,str);i++){
        vector<unsigned int > intVec;
        string token;
        istringstream stream(str);

        if(i==0){
            for(int j=0;getline(stream,token,',');j++){
                if(j==0)continue;
                _wordList.push_back(token);
            }
            continue;
        }
        for(int j=0;getline(stream,token,',');j++){
            if(j==0)continue;
            intVec.push_back(stoi(token));
        }
        _frequencyMatrix.push_back(intVec);
    }

    _V = _wordList.size();
}